

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UBool utext_equals_63(UText *a,UText *b)

{
  int64_t iVar1;
  int64_t iVar2;
  bool bVar3;
  
  if ((b != (UText *)0x0 && a != (UText *)0x0) && (a->magic == 0x345ad82c)) {
    if (((b->magic == 0x345ad82c) && (a->pFuncs == b->pFuncs)) && (a->context == b->context)) {
      iVar1 = utext_getNativeIndex_63(a);
      iVar2 = utext_getNativeIndex_63(b);
      bVar3 = iVar1 == iVar2;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
utext_equals(const UText *a, const UText *b) {
    if (a==NULL || b==NULL ||
        a->magic != UTEXT_MAGIC ||
        b->magic != UTEXT_MAGIC) {
            // Null or invalid arguments don't compare equal to anything.
            return FALSE;
    }

    if (a->pFuncs != b->pFuncs) {
        // Different types of text providers.
        return FALSE;
    }

    if (a->context != b->context) {
        // Different sources (different strings)
        return FALSE;
    }
    if (utext_getNativeIndex(a) != utext_getNativeIndex(b)) {
        // Different current position in the string.
        return FALSE;
    }

    return TRUE;
}